

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O2

void __thiscall DepsLog::~DepsLog(DepsLog *this)

{
  Close(this);
  std::_Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>::~_Vector_base
            (&(this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>);
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
            (&(this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>);
  return;
}

Assistant:

DepsLog::~DepsLog() {
  Close();
}